

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

int SstFFSGetLocalDeferred
              (SstStream Stream,void *Variable,char *Name,size_t DimCount,int BlockID,size_t *Count,
              void *Data)

{
  void *pvVar1;
  FFSVarRec_conflict pFVar2;
  undefined8 *__s;
  void *pvVar3;
  long in_RCX;
  undefined8 in_RDX;
  void *in_RSI;
  SstStream in_RDI;
  uint in_R8D;
  undefined8 *in_R9;
  FFSArrayRequest_conflict Req;
  void *IncomingDataBase;
  FFSVarRec_conflict Var;
  int GetFromWriter;
  FFSReaderMarshalBase *Info;
  uint local_4;
  
  pvVar1 = in_RDI->ReaderMarshalData;
  pFVar2 = LookupVarByKey(in_RDI,in_RSI);
  if (in_RCX != 0) {
    __s = (undefined8 *)malloc(0x38);
    memset(__s,0,0x38);
    *__s = pFVar2;
    *(undefined4 *)(__s + 1) = 1;
    __s[2] = (long)(int)in_R8D;
    CP_verbose(in_RDI,TraceVerbose,"Get request local, Name %s, BlockID %d, Count %zu\n",in_RDX,
               (ulong)in_R8D,*in_R9);
    pvVar3 = malloc(pFVar2->DimCount << 3);
    __s[4] = pvVar3;
    memcpy((void *)__s[4],in_R9,pFVar2->DimCount << 3);
    __s[5] = Req;
    __s[6] = *(undefined8 *)((long)pvVar1 + 0x18);
    *(undefined8 **)((long)pvVar1 + 0x18) = __s;
  }
  else {
    memcpy(Req,(void *)(**(long **)((long)pvVar1 + 0x20) + *pFVar2->PerWriterMetaFieldOffset),
           (long)pFVar2->ElementSize);
  }
  local_4 = (uint)(in_RCX != 0);
  return local_4;
}

Assistant:

extern int SstFFSGetLocalDeferred(SstStream Stream, void *Variable, const char *Name,
                                  size_t DimCount, const int BlockID, const size_t *Count,
                                  void *Data)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    int GetFromWriter = 0;
    FFSVarRec Var = LookupVarByKey(Stream, Variable);

    // if Variable is in Metadata (I.E. DimCount == 0), move incoming data to
    // Data area
    if (DimCount == 0)
    {
        void *IncomingDataBase = ((char *)Info->MetadataBaseAddrs[GetFromWriter]) +
                                 Var->PerWriterMetaFieldOffset[GetFromWriter];
        memcpy(Data, IncomingDataBase, Var->ElementSize);
        return 0; // No Sync needed
    }
    else
    {
        // Build request structure and enter it into requests list
        FFSArrayRequest Req = malloc(sizeof(*Req));
        memset(Req, 0, sizeof(*Req));
        Req->VarRec = Var;
        Req->RequestType = Local;
        Req->BlockID = BlockID;
        // make a copy of Count request
        CP_verbose(Stream, TraceVerbose, "Get request local, Name %s, BlockID %d, Count %zu\n",
                   Name, BlockID, Count[0]);
        Req->Count = malloc(sizeof(Count[0]) * Var->DimCount);
        memcpy(Req->Count, Count, sizeof(Count[0]) * Var->DimCount);
        Req->Data = Data;
        Req->Next = Info->PendingVarRequests;
        Info->PendingVarRequests = Req;
        return 1; // Later Sync needed
    }
}